

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::WriteNinjaWorkDir(cmLocalNinjaGenerator *this,ostream *os)

{
  string *psVar1;
  ostream *poVar2;
  string local_98;
  undefined1 local_78 [8];
  string ninja_workdir;
  cmGlobalNinjaGenerator *ng;
  allocator<char> local_39;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  cmLocalNinjaGenerator *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  cmGlobalNinjaGenerator::WriteDivider(os);
  poVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Logical path to working directory; prefix for absolute paths.",
             &local_39);
  cmGlobalNinjaGenerator::WriteComment(poVar2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  ninja_workdir.field_2._8_8_ = GetGlobalNinjaGenerator(this);
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)local_78,(string *)psVar1);
  cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix
            ((cmGlobalNinjaGenerator *)ninja_workdir.field_2._8_8_,(string *)local_78);
  poVar2 = std::operator<<(local_18,"cmake_ninja_workdir = ");
  cmGlobalNinjaGenerator::EncodePath
            (&local_98,(cmGlobalNinjaGenerator *)ninja_workdir.field_2._8_8_,(string *)local_78);
  poVar2 = std::operator<<(poVar2,(string *)&local_98);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaWorkDir(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  cmGlobalNinjaGenerator::WriteComment(
    os, "Logical path to working directory; prefix for absolute paths.");
  cmGlobalNinjaGenerator* ng = this->GetGlobalNinjaGenerator();
  std::string ninja_workdir = this->GetBinaryDirectory();
  ng->StripNinjaOutputPathPrefixAsSuffix(ninja_workdir); // Also appends '/'.
  os << "cmake_ninja_workdir = " << ng->EncodePath(ninja_workdir) << "\n";
}